

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db)

{
  Db *pDVar1;
  Btree *p;
  FuncDef *pFVar2;
  void *p_00;
  Module *pMod;
  int iVar3;
  int i;
  long lVar4;
  FuncDef *p_01;
  long lVar5;
  HashElem *pHVar6;
  
  if ((db->magic == 0x64cffc7f) && (iVar3 = connectionIsBusy(db), iVar3 == 0)) {
    sqlite3RollbackAll(db,0);
    sqlite3CloseSavepoints(db);
    lVar5 = 8;
    for (lVar4 = 0; pDVar1 = db->aDb, lVar4 < db->nDb; lVar4 = lVar4 + 1) {
      p = *(Btree **)((long)&pDVar1->zDbSName + lVar5);
      if (p != (Btree *)0x0) {
        sqlite3BtreeClose(p);
        *(undefined8 *)((long)&pDVar1->zDbSName + lVar5) = 0;
        if (lVar4 != 1) {
          *(undefined8 *)(&pDVar1->safety_level + lVar5) = 0;
        }
      }
      lVar5 = lVar5 + 0x20;
    }
    if (pDVar1[1].pSchema != (Schema *)0x0) {
      sqlite3SchemaClear(pDVar1[1].pSchema);
    }
    sqlite3VtabUnlockList(db);
    sqlite3CollapseDatabaseArray(db);
    pHVar6 = (HashElem *)&(db->aFunc).first;
    while (pHVar6 = pHVar6->next, pHVar6 != (HashElem *)0x0) {
      p_01 = (FuncDef *)pHVar6->data;
      do {
        functionDestroy(db,p_01);
        pFVar2 = p_01->pNext;
        sqlite3DbFree(db,p_01);
        p_01 = pFVar2;
      } while (pFVar2 != (FuncDef *)0x0);
    }
    sqlite3HashClear(&db->aFunc);
    pHVar6 = (HashElem *)&(db->aCollSeq).first;
    while (pHVar6 = pHVar6->next, pHVar6 != (HashElem *)0x0) {
      p_00 = pHVar6->data;
      for (lVar5 = 0x20; lVar5 != 0x98; lVar5 = lVar5 + 0x28) {
        if (*(code **)((long)p_00 + lVar5) != (code *)0x0) {
          (**(code **)((long)p_00 + lVar5))(*(undefined8 *)((long)p_00 + lVar5 + -0x10));
        }
      }
      sqlite3DbFree(db,p_00);
    }
    sqlite3HashClear(&db->aCollSeq);
    pHVar6 = (HashElem *)&(db->aModule).first;
    while (pHVar6 = pHVar6->next, pHVar6 != (HashElem *)0x0) {
      pMod = (Module *)pHVar6->data;
      if (pMod->xDestroy != (_func_void_void_ptr *)0x0) {
        (*pMod->xDestroy)(pMod->pAux);
      }
      sqlite3VtabEponymousTableClear(db,pMod);
      sqlite3DbFree(db,pMod);
    }
    sqlite3HashClear(&db->aModule);
    sqlite3Error(db,0);
    sqlite3ValueFree(db->pErr);
    for (lVar5 = 0; lVar5 < db->nExtension; lVar5 = lVar5 + 1) {
      (*db->pVfs->xDlClose)(db->pVfs,db->aExtension[lVar5]);
    }
    sqlite3DbFree(db,db->aExtension);
    db->magic = 0xb5357930;
    sqlite3DbFree(db,db->aDb[1].pSchema);
    if (db->mutex == (sqlite3_mutex *)0x0) {
      db->magic = 0x9f3c2d33;
    }
    else {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      db->magic = 0x9f3c2d33;
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(db->mutex);
      }
    }
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    sqlite3_free(db);
    return;
  }
  if (db->mutex == (sqlite3_mutex *)0x0) {
    return;
  }
  (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db){
  HashElem *i;                    /* Hash table iterator */
  int j;

  /* If there are outstanding sqlite3_stmt or sqlite3_backup objects
  ** or if the connection has not yet been closed by sqlite3_close_v2(),
  ** then just leave the mutex and return.
  */
  if( db->magic!=SQLITE_MAGIC_ZOMBIE || connectionIsBusy(db) ){
    sqlite3_mutex_leave(db->mutex);
    return;
  }

  /* If we reach this point, it means that the database connection has
  ** closed all sqlite3_stmt and sqlite3_backup objects and has been
  ** passed to sqlite3_close (meaning that it is a zombie).  Therefore,
  ** go ahead and free all resources.
  */

  /* If a transaction is open, roll it back. This also ensures that if
  ** any database schemas have been modified by an uncommitted transaction
  ** they are reset. And that the required b-tree mutex is held to make
  ** the pager rollback and schema reset an atomic operation. */
  sqlite3RollbackAll(db, SQLITE_OK);

  /* Free any outstanding Savepoint structures. */
  sqlite3CloseSavepoints(db);

  /* Close all database connections */
  for(j=0; j<db->nDb; j++){
    struct Db *pDb = &db->aDb[j];
    if( pDb->pBt ){
      sqlite3BtreeClose(pDb->pBt);
      pDb->pBt = 0;
      if( j!=1 ){
        pDb->pSchema = 0;
      }
    }
  }
  /* Clear the TEMP schema separately and last */
  if( db->aDb[1].pSchema ){
    sqlite3SchemaClear(db->aDb[1].pSchema);
  }
  sqlite3VtabUnlockList(db);

  /* Free up the array of auxiliary databases */
  sqlite3CollapseDatabaseArray(db);
  assert( db->nDb<=2 );
  assert( db->aDb==db->aDbStatic );

  /* Tell the code in notify.c that the connection no longer holds any
  ** locks and does not require any further unlock-notify callbacks.
  */
  sqlite3ConnectionClosed(db);

  for(i=sqliteHashFirst(&db->aFunc); i; i=sqliteHashNext(i)){
    FuncDef *pNext, *p;
    p = sqliteHashData(i);
    do{
      functionDestroy(db, p);
      pNext = p->pNext;
      sqlite3DbFree(db, p);
      p = pNext;
    }while( p );
  }
  sqlite3HashClear(&db->aFunc);
  for(i=sqliteHashFirst(&db->aCollSeq); i; i=sqliteHashNext(i)){
    CollSeq *pColl = (CollSeq *)sqliteHashData(i);
    /* Invoke any destructors registered for collation sequence user data. */
    for(j=0; j<3; j++){
      if( pColl[j].xDel ){
        pColl[j].xDel(pColl[j].pUser);
      }
    }
    sqlite3DbFree(db, pColl);
  }
  sqlite3HashClear(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=sqliteHashFirst(&db->aModule); i; i=sqliteHashNext(i)){
    Module *pMod = (Module *)sqliteHashData(i);
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    sqlite3VtabEponymousTableClear(db, pMod);
    sqlite3DbFree(db, pMod);
  }
  sqlite3HashClear(&db->aModule);
#endif

  sqlite3Error(db, SQLITE_OK); /* Deallocates any cached error strings. */
  sqlite3ValueFree(db->pErr);
  sqlite3CloseExtensions(db);
#if SQLITE_USER_AUTHENTICATION
  sqlite3_free(db->auth.zAuthUser);
  sqlite3_free(db->auth.zAuthPW);
#endif

  db->magic = SQLITE_MAGIC_ERROR;

  /* The temp-database schema is allocated differently from the other schema
  ** objects (using sqliteMalloc() directly, instead of sqlite3BtreeSchema()).
  ** So it needs to be freed here. Todo: Why not roll the temp schema into
  ** the same sqliteMalloc() as the one that allocates the database 
  ** structure?
  */
  sqlite3DbFree(db, db->aDb[1].pSchema);
  sqlite3_mutex_leave(db->mutex);
  db->magic = SQLITE_MAGIC_CLOSED;
  sqlite3_mutex_free(db->mutex);
  assert( sqlite3LookasideUsed(db,0)==0 );
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  sqlite3_free(db);
}